

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_1564198::HandleRandomCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  ulong uVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  long lVar5;
  int iVar6;
  size_t sVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  string_view value;
  vector<char,_std::allocator<char>_> result;
  string alphabet;
  char cmStringCommandDefaultAlphabet [63];
  uint local_d0;
  char local_c9;
  vector<char,_std::allocator<char>_> local_c8;
  double local_a8;
  double dStack_a0;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  long *local_78;
  char acStack_70 [8];
  long local_68;
  char acStack_60 [48];
  
  uVar11 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  if ((uVar11 < 6) && ((0x2bUL >> (uVar11 & 0x3f) & 1) != 0)) {
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"sub-command RANDOM requires at least one argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    return false;
  }
  builtin_strncpy(acStack_60 + 8,"UIOPASDFGHJKLZXCVBNM0123456789",0x1f);
  local_68._0_1_ = 'j';
  local_68._1_1_ = 'k';
  local_68._2_1_ = 'l';
  local_68._3_1_ = 'z';
  local_68._4_1_ = 'x';
  local_68._5_1_ = 'c';
  local_68._6_1_ = 'v';
  local_68._7_1_ = 'b';
  builtin_strncpy(acStack_60,"nmQWERTY",8);
  local_78 = (long *)0x6975797472657771;
  builtin_strncpy(acStack_70,"opasdfgh",8);
  local_98 = &local_88;
  local_90 = 0;
  local_88 = 0;
  iVar9 = 5;
  uVar2 = (ulong)local_a8 >> 0x20;
  local_a8 = (double)(uVar2 << 0x20);
  if (uVar11 < 4) {
    local_d0 = 0;
LAB_003bd275:
    strlen((char *)&local_78);
    std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,(ulong)&local_78);
    if (local_90 != 0) goto LAB_003bd2a4;
    local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"sub-command RANDOM invoked with bad alphabet.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    local_a8 = (double)(uVar2 << 0x20);
    local_d0 = 0;
    if (uVar11 - 2 < 2) goto LAB_003bd275;
    uVar10 = 1;
    local_a8 = (double)(uVar2 << 0x20);
    local_d0 = 0;
    do {
      iVar6 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10));
      if (iVar6 == 0) {
        uVar10 = uVar10 + 1;
        iVar9 = atoi((args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p);
      }
      else {
        iVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar6 == 0) {
          uVar10 = uVar10 + 1;
          std::__cxx11::string::_M_assign((string *)&local_98);
        }
        else {
          iVar6 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar10));
          if (iVar6 == 0) {
            uVar10 = uVar10 + 1;
            local_d0 = atoi((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p);
            local_a8 = (double)CONCAT44(local_a8._4_4_,
                                        (int)CONCAT71((uint7)(uint3)(local_d0 >> 8),1));
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar11 - 2);
    if (local_90 == 0) goto LAB_003bd275;
LAB_003bd2a4:
    lVar5 = local_90;
    if (0 < iVar9) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (char *)0x0;
      local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (char *)0x0;
      if (((~(anonymous_namespace)::
             HandleRandomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
             ::seeded | SUB81(local_a8,0)) & 1) != 0) {
        (anonymous_namespace)::
        HandleRandomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::seeded = 1;
        if (((ulong)local_a8 & 1) == 0) {
          local_d0 = cmSystemTools::RandomSeed();
        }
        srand(local_d0);
      }
      puVar4 = local_98;
      auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar12._0_8_ = lVar5;
      auVar12._12_4_ = 0x45300000;
      dStack_a0 = auVar12._8_8_ - 1.9342813113834067e+25;
      local_a8 = dStack_a0 + ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
      do {
        iVar6 = rand();
        if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     puVar4 + (int)((double)iVar6 * local_a8 * 4.656612873077393e-10));
        }
        else {
          *local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish = puVar4[(int)((double)iVar6 * local_a8 * 4.656612873077393e-10)];
          local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      local_c9 = '\0';
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_c8,&local_c9);
      pcVar3 = local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      this = status->Makefile;
      sVar7 = strlen(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
      value._M_str = pcVar3;
      value._M_len = sVar7;
      cmMakefile::AddDefinition(this,pbVar1 + -1,value);
      if ((pointer *)
          local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0) {
        operator_delete(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      bVar8 = true;
      goto LAB_003bd43f;
    }
    local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"sub-command RANDOM invoked with bad length.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  if ((pointer *)
      local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1));
  }
  bVar8 = false;
LAB_003bd43f:
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return bVar8;
}

Assistant:

bool HandleRandomCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2 || args.size() == 3 || args.size() == 5) {
    status.SetError("sub-command RANDOM requires at least one argument.");
    return false;
  }

  static bool seeded = false;
  bool force_seed = false;
  unsigned int seed = 0;
  int length = 5;
  const char cmStringCommandDefaultAlphabet[] = "qwertyuiopasdfghjklzxcvbnm"
                                                "QWERTYUIOPASDFGHJKLZXCVBNM"
                                                "0123456789";
  std::string alphabet;

  if (args.size() > 3) {
    size_t i = 1;
    size_t stopAt = args.size() - 2;

    for (; i < stopAt; ++i) {
      if (args[i] == "LENGTH") {
        ++i;
        length = atoi(args[i].c_str());
      } else if (args[i] == "ALPHABET") {
        ++i;
        alphabet = args[i];
      } else if (args[i] == "RANDOM_SEED") {
        ++i;
        seed = static_cast<unsigned int>(atoi(args[i].c_str()));
        force_seed = true;
      }
    }
  }
  if (alphabet.empty()) {
    alphabet = cmStringCommandDefaultAlphabet;
  }

  double sizeofAlphabet = static_cast<double>(alphabet.size());
  if (sizeofAlphabet < 1) {
    status.SetError("sub-command RANDOM invoked with bad alphabet.");
    return false;
  }
  if (length < 1) {
    status.SetError("sub-command RANDOM invoked with bad length.");
    return false;
  }
  const std::string& variableName = args.back();

  std::vector<char> result;

  if (!seeded || force_seed) {
    seeded = true;
    srand(force_seed ? seed : cmSystemTools::RandomSeed());
  }

  const char* alphaPtr = alphabet.c_str();
  for (int cc = 0; cc < length; cc++) {
    int idx = static_cast<int>(sizeofAlphabet * rand() / (RAND_MAX + 1.0));
    result.push_back(*(alphaPtr + idx));
  }
  result.push_back(0);

  status.GetMakefile().AddDefinition(variableName, result.data());
  return true;
}